

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcherSD.cpp
# Opt level: O0

int __thiscall Kernel::MLMatcherSD::Impl::init(Impl *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  LiteralList **in_stack_00000040;
  Clause *in_stack_00000048;
  uint in_stack_00000054;
  Literal **in_stack_00000058;
  Impl *in_stack_00000060;
  
  initMatchingData(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000048,
                   in_stack_00000040);
  return extraout_EAX;
}

Assistant:

void MLMatcherSD::Impl::init(Literal** baseLits, unsigned baseLen, Clause* instance, LiteralList const* const* alts)
{
#if MLMATCHERSD_DEBUG_OUTPUT
    std::cerr << "\n\n\nMLMatcherSD::init:" << std::endl;
    for (unsigned i = 0; i < baseLen; ++i) {
      std::cerr <<   "\tbases[" << i << "]: " << baseLits[i]->toString() << std::endl;
      LiteralList::Iterator ait(alts[i]);
      while(ait.hasNext()) {
        std::cerr << "\t     alt: " << ait.next()->toString() << std::endl;
      }
    }
    std::cerr << "\tinstance: " << instance->toString() << std::endl;
#endif
  initMatchingData(baseLits, baseLen, instance, alts);
}